

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgToken.cpp
# Opt level: O3

void __thiscall rsg::TokenStream::TokenStream(TokenStream *this)

{
  pointer pTVar1;
  long lVar2;
  
  (this->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar1 = (pointer)operator_new(0x400);
  (this->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
  super__Vector_impl_data._M_start = pTVar1;
  (this->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pTVar1 + 0x40;
  lVar2 = 0;
  do {
    *(undefined4 *)((long)&pTVar1->m_type + lVar2) = 0x53;
    *(undefined8 *)((long)&pTVar1->m_arg + lVar2) = 0;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x400);
  (this->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = pTVar1 + 0x40;
  this->m_numTokens = 0;
  return;
}

Assistant:

TokenStream::TokenStream (void)
	: m_tokens		(ALLOC_SIZE)
	, m_numTokens	(0)
{
}